

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O3

void __thiscall duckdb::AlterTableInfo::AlterTableInfo(AlterTableInfo *this,AlterTableType type)

{
  *(undefined2 *)&(this->super_AlterInfo).super_ParseInfo.info_type = 0x100;
  (this->super_AlterInfo).catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterInfo).catalog.field_2;
  (this->super_AlterInfo).catalog._M_string_length = 0;
  (this->super_AlterInfo).catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).schema._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).schema.field_2
  ;
  (this->super_AlterInfo).schema._M_string_length = 0;
  (this->super_AlterInfo).schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).name._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).name.field_2;
  (this->super_AlterInfo).name._M_string_length = 0;
  (this->super_AlterInfo).name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AlterViewInfo_0244ffc8;
  (this->super_AlterInfo).field_0x71 = type;
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}